

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

LineTable * __thiscall llvm::DWARFContext::getLineTableForUnit(DWARFContext *this,DWARFUnit *U)

{
  undefined1 auVar1 [8];
  code *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  Error local_28;
  undefined1 local_20 [8];
  Expected<const_llvm::DWARFDebugLine::LineTable_*> ExpectedLineTable;
  
  local_40 = 0;
  local_48 = dumpWarning;
  local_30 = std::_Function_handler<void_(llvm::Error),_void_(*)(llvm::Error)>::_M_invoke;
  local_38 = std::_Function_handler<void_(llvm::Error),_void_(*)(llvm::Error)>::_M_manager;
  getLineTableForUnit((DWARFContext *)local_20,(DWARFUnit *)this,(function<void_(llvm::Error)> *)U);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  auVar1 = local_20;
  if ((ExpectedLineTable.field_0.TStorage.buffer[0] & 1U) != 0) {
    local_20 = (undefined1  [8])0x0;
    local_28.Payload = (ErrorInfoBase *)((ulong)auVar1 | 1);
    dumpWarning(&local_28);
    if ((long *)((ulong)local_28.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_28.Payload & 0xfffffffffffffffe) + 8))();
    }
    auVar1 = (undefined1  [8])(LineTable *)0x0;
  }
  if (((ExpectedLineTable.field_0.TStorage.buffer[0] & 1U) != 0) &&
     (local_20 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (LineTable *)auVar1;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFContext::getLineTableForUnit(DWARFUnit *U) {
  Expected<const DWARFDebugLine::LineTable *> ExpectedLineTable =
      getLineTableForUnit(U, dumpWarning);
  if (!ExpectedLineTable) {
    dumpWarning(ExpectedLineTable.takeError());
    return nullptr;
  }
  return *ExpectedLineTable;
}